

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

int lua_rawequal(lua_State *L,int idx1,int idx2)

{
  int iVar1;
  TValue *o1;
  TValue *o2;
  TValue *pTVar2;
  
  o1 = index2adr(L,idx1);
  o2 = index2adr(L,idx2);
  pTVar2 = (TValue *)((ulong)(L->glref).ptr32 + 0x68);
  if (o2 == pTVar2 || o1 == pTVar2) {
    return 0;
  }
  iVar1 = lj_obj_equal(o1,o2);
  return iVar1;
}

Assistant:

LUA_API int lua_rawequal(lua_State *L, int idx1, int idx2)
{
  cTValue *o1 = index2adr(L, idx1);
  cTValue *o2 = index2adr(L, idx2);
  return (o1 == niltv(L) || o2 == niltv(L)) ? 0 : lj_obj_equal(o1, o2);
}